

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_naive_matches_jmp_::run
          (Test_bitileave_ileaveBytes_naive_matches_jmp_ *this)

{
  SourceLocation loc;
  bool bVar1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_150;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_119;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string_view local_78;
  undefined4 local_64;
  uint64_t **ppuStack_60;
  Cmp cmp_;
  uint64_t *tr_;
  uint64_t *tl_;
  uint64_t naive;
  uint64_t jmp;
  uint64_t bytesAsInt;
  size_t i;
  uniform_int_distribution<unsigned_long> distr;
  fast_rng64 rng;
  size_t iterations;
  Test_bitileave_ileaveBytes_naive_matches_jmp_ *this_local;
  
  std::linear_congruential_engine<unsigned_long,_6364136223846793005UL,_1442695040888963407UL,_0UL>
  ::linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_6364136223846793005UL,_1442695040888963407UL,_0UL>
              *)&distr._M_param._M_b,0x3039);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&i);
  bytesAsInt = 0;
  while( true ) {
    if (0x3fff < bytesAsInt) {
      return;
    }
    jmp = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&i,
                     (linear_congruential_engine<unsigned_long,_6364136223846793005UL,_1442695040888963407UL,_0UL>
                      *)&distr._M_param._M_b);
    naive = detail::ileaveBytes_jmp(jmp,bytesAsInt % 9);
    tl_ = (uint64_t *)detail::ileaveBytes_naive(jmp,bytesAsInt % 9);
    tr_ = &naive;
    ppuStack_60 = &tl_;
    local_64 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      (tr_,(unsigned_long *)ppuStack_60);
    local_119 = 0;
    local_12d = 0;
    local_12e = 0;
    if (!bVar1) break;
    local_119 = 0;
    local_12d = 0;
    local_12e = 0;
    bytesAsInt = bytesAsInt + 1;
  }
  stringify<unsigned_long>(&local_118,tr_);
  local_119 = 1;
  std::operator+(&local_f8,"Comparison failed: jmp == naive (with \"jmp\"=",&local_118);
  local_12d = 1;
  std::operator+(&local_d8,&local_f8,", \"naive\"=");
  local_12e = 1;
  stringify<unsigned_long>(&local_150,(unsigned_long *)ppuStack_60);
  std::operator+(&local_b8,&local_d8,&local_150);
  std::operator+(&local_98,&local_b8,")");
  local_78 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0xd4;
  assertFail(local_78,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_naive_matches_jmp)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint64_t bytesAsInt = distr(rng);

        std::uint64_t jmp = detail::ileaveBytes_jmp(bytesAsInt, i % 9);
        std::uint64_t naive = detail::ileaveBytes_naive(bytesAsInt, i % 9);
        BITMANIP_ASSERT_EQ(jmp, naive);
    }
}